

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_fclose(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long *pChunk;
  jx9_vm *pjVar1;
  code *pcVar2;
  jx9_value *pObj;
  jx9_real jVar3;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (pChunk = (long *)((*apArg)->x).pOther, pChunk == (long *)0x0)) ||
     (*(int *)((long)pChunk + 0x34) != 0xfeac14)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Expecting an IO handle");
    jVar3 = 0.0;
  }
  else if (*pChunk == 0) {
    jVar3 = 0.0;
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString,"null_stream");
  }
  else {
    pjVar1 = pCtx->pVm;
    jVar3 = 4.94065645841247e-324;
    if (((pChunk != (long *)pjVar1->pStdin) && (pChunk != (long *)pjVar1->pStdout)) &&
       (pChunk != (long *)pjVar1->pStderr)) {
      pcVar2 = *(code **)(*pChunk + 0x20);
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)(pChunk[1]);
      }
      SyBlobRelease((SyBlob *)(pChunk + 2));
      *(undefined4 *)((long)pChunk + 0x34) = 0x2126;
      jx9_context_free_chunk(pCtx,pChunk);
      jx9MemObjRelease(*apArg);
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar3;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_fclose(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	jx9_vm *pVm;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the VM that own this context */
	pVm = pCtx->pVm;
	/* TICKET 1433-62: Keep the STDIN/STDOUT/STDERR handles open */
	if( pDev != pVm->pStdin && pDev != pVm->pStdout && pDev != pVm->pStderr ){
		/* Perform the requested operation */
		jx9StreamCloseHandle(pStream, pDev->pHandle);
		/* Release the IO private structure */
		ReleaseIOPrivate(pCtx, pDev);
		/* Invalidate the resource handle */
		jx9_value_release(apArg[0]);
	}
	/* Return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}